

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O3

int attach_get_offered_capabilities(ATTACH_HANDLE attach,AMQP_VALUE *offered_capabilities_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  int iVar3;
  AMQP_VALUE pAVar4;
  bool bVar5;
  uint32_t item_count;
  char *offered_capabilities_single_value;
  uint local_3c;
  char *local_38;
  
  if (attach == (ATTACH_HANDLE)0x0) {
    return 0x136e;
  }
  iVar1 = amqpvalue_get_composite_item_count(attach->composite_value,&local_3c);
  if (iVar1 != 0) {
    return 0x1376;
  }
  if (local_3c < 0xc) {
    return 0x137c;
  }
  pAVar4 = amqpvalue_get_composite_item_in_place(attach->composite_value,0xb);
  if (pAVar4 == (AMQP_VALUE)0x0) {
    return 0x1384;
  }
  AVar2 = amqpvalue_get_type(pAVar4);
  if (AVar2 == AMQP_TYPE_NULL) {
    return 0x1384;
  }
  AVar2 = amqpvalue_get_type(pAVar4);
  if (AVar2 == AMQP_TYPE_ARRAY) {
    local_38 = (char *)0x0;
    AVar2 = amqpvalue_get_type(pAVar4);
    bVar5 = true;
    if (AVar2 != AMQP_TYPE_ARRAY) {
      return 0x1397;
    }
  }
  else {
    iVar1 = amqpvalue_get_symbol(pAVar4,&local_38);
    bVar5 = iVar1 != 0;
    AVar2 = amqpvalue_get_type(pAVar4);
    if (AVar2 != AMQP_TYPE_ARRAY) {
      if (iVar1 != 0) {
        return 0x1397;
      }
      goto LAB_0013d9b7;
    }
  }
  iVar1 = amqpvalue_get_array(pAVar4,offered_capabilities_value);
  if ((bool)(iVar1 != 0 & bVar5)) {
    return 0x1397;
  }
LAB_0013d9b7:
  AVar2 = amqpvalue_get_type(pAVar4);
  iVar1 = 0;
  if (AVar2 != AMQP_TYPE_ARRAY) {
    pAVar4 = amqpvalue_create_array();
    *offered_capabilities_value = pAVar4;
    if (pAVar4 == (AMQP_VALUE)0x0) {
      iVar1 = 0x13a0;
    }
    else {
      pAVar4 = amqpvalue_create_symbol(local_38);
      if (pAVar4 == (AMQP_VALUE)0x0) {
        iVar1 = 0x13a7;
      }
      else {
        iVar3 = amqpvalue_add_array_item(*offered_capabilities_value,pAVar4);
        iVar1 = 0x13ad;
        if (iVar3 == 0) {
          iVar3 = amqpvalue_set_composite_item
                            (attach->composite_value,0xb,*offered_capabilities_value);
          iVar1 = 0x13b3;
          if (iVar3 == 0) {
            iVar1 = 0;
          }
        }
        amqpvalue_destroy(pAVar4);
      }
      amqpvalue_destroy(*offered_capabilities_value);
    }
  }
  return iVar1;
}

Assistant:

int attach_get_offered_capabilities(ATTACH_HANDLE attach, AMQP_VALUE* offered_capabilities_value)
{
    int result;

    if (attach == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        ATTACH_INSTANCE* attach_instance = (ATTACH_INSTANCE*)attach;
        if (amqpvalue_get_composite_item_count(attach_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 11)
            {
                result = MU_FAILURE;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(attach_instance->composite_value, 11);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    result = MU_FAILURE;
                }
                else
                {
                    const char* offered_capabilities_single_value;
                    int get_single_value_result;
                    if (amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY)
                    {
                        get_single_value_result = amqpvalue_get_symbol(item_value, &offered_capabilities_single_value);
                    }
                    else
                    {
                        (void)memset((void*)&offered_capabilities_single_value, 0, sizeof(offered_capabilities_single_value));
                        get_single_value_result = 1;
                    }

                    if (((amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY) || (amqpvalue_get_array(item_value, offered_capabilities_value) != 0)) &&
                        (get_single_value_result != 0))
                    {
                        result = MU_FAILURE;
                    }
                    else
                    {
                        if (amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY)
                        {
                            *offered_capabilities_value = amqpvalue_create_array();
                            if (*offered_capabilities_value == NULL)
                            {
                                result = MU_FAILURE;
                            }
                            else
                            {
                                AMQP_VALUE single_amqp_value = amqpvalue_create_symbol(offered_capabilities_single_value);
                                if (single_amqp_value == NULL)
                                {
                                    result = MU_FAILURE;
                                }
                                else
                                {
                                    if (amqpvalue_add_array_item(*offered_capabilities_value, single_amqp_value) != 0)
                                    {
                                        result = MU_FAILURE;
                                    }
                                    else
                                    {
                                        if (amqpvalue_set_composite_item(attach_instance->composite_value, 11, *offered_capabilities_value) != 0)
                                        {
                                            result = MU_FAILURE;
                                        }
                                        else
                                        {
                                            result = 0;
                                        }
                                    }

                                    amqpvalue_destroy(single_amqp_value);
                                }
                                amqpvalue_destroy(*offered_capabilities_value);
                            }
                        }
                        else
                        {
                            result = 0;
                        }
                    }
                }
            }
        }
    }

    return result;
}